

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_default
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar5;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type_conflict *pmVar9;
  bool local_5b1;
  String local_520;
  allocator<char> local_4f9;
  String local_4f8;
  String local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  undefined1 local_4a0 [8];
  StringIntMap bindingPoints;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  String *u;
  StringVector list;
  String local_3c8;
  LayoutBindingProgramAutoPtr local_3a8;
  LayoutBindingProgramAutoPtr program;
  String local_380;
  allocator<char> local_359;
  string local_358 [32];
  string local_338 [32];
  String local_318;
  string local_2f8 [32];
  String local_2d8;
  allocator<char> local_2b1;
  String local_2b0;
  string local_290 [32];
  String local_270;
  allocator<char> local_249;
  String local_248;
  undefined1 local_228 [8];
  String decl;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [8];
  StringStream s;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  s.super_ostringstream._375_1_ = 1;
  StringStream::StringStream((StringStream *)local_198);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1d8,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (local_1b8,this,local_1d8);
  poVar4 = std::operator<<((ostream *)local_198,local_1b8);
  std::operator<<(poVar4,";\n");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::str();
  setTemplateParam(this,"UNIFORM_ACCESS",(String *)((long)&decl.field_2 + 8));
  std::__cxx11::string::~string((string *)(decl.field_2._M_local_buf + 8));
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  pcVar1 = *(char **)CONCAT44(extraout_var,iVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar1,&local_249);
  std::__cxx11::string::string(local_290);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (&local_270,this,local_290);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,pcVar1,&local_2b1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2f8,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_2d8,this,local_2f8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_338,this,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"float",&local_359);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
            (&local_318,this,local_338,local_358);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_380,this,0);
  std::__cxx11::string::string((string *)&program);
  buildUniformDecl((String *)local_228,this,&local_248,&local_270,&local_2b0,&local_2d8,&local_318,
                   &local_380,(String *)&program);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  setTemplateParam(this,"UNIFORM_DECL",(String *)local_228);
  updateTemplate(this);
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
            (&local_3a8,&this->super_IProgramContextSupplier);
  pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3a8);
  bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar5);
  bVar2 = (s.super_ostringstream._375_1_ & 1 & bVar2) != 0;
  s.super_ostringstream._375_1_ = bVar2;
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&u);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_430,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_410,this,local_430);
    std::__cxx11::string::~string(local_430);
    local_3f0 = &local_410;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_450,local_3f0,"_block");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&u,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
    }
    else {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count,this,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&u,(value_type *)
                        &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&u);
    (*pLVar5->_vptr_LayoutBindingProgram[3])(local_4a0,pLVar5,&local_4b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b8);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_4a0);
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&u);
    local_5b1 = false;
    if (sVar7 == sVar8) {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_4a0,local_3f0);
      local_5b1 = *pmVar9 == 0;
    }
    bVar2 = (s.super_ostringstream._375_1_ & 1 & local_5b1) != 0;
    s.super_ostringstream._375_1_ = bVar2;
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_520);
      LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_520,false)
      ;
      std::__cxx11::string::~string((string *)&local_520);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"binding point did not match default",&local_4f9);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_4a0,local_3f0);
      generateLog<int,int>(&local_4d8,this,&local_4f8,*pmVar9,0);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,&local_4d8,false);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
    }
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_4a0);
    std::__cxx11::string::~string((string *)&local_410);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&u);
  }
  else {
    pLVar5 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3a8);
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3c8,pLVar5,false);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar2,&local_3c8,false);
    std::__cxx11::string::~string((string *)&local_3c8);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3a8);
  std::__cxx11::string::~string((string *)local_228);
  StringStream::~StringStream((StringStream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_default()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	String decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String()),
								   String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								   buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
	setTemplateParam("UNIFORM_DECL", decl);
	updateTemplate();

	LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
	passed &= program->compiledAndLinked();
	if (!passed)
	{
		return LayoutBindingTestResult(passed, program->getErrorLog());
	}

	StringVector  list;
	const String& u = buildBlockName(getDefaultUniformName());
	if (!u.empty())
		list.push_back(u + "_block");
	else
		list.push_back(getDefaultUniformName());

	StringIntMap bindingPoints = program->getBindingPoints(list);

	passed &= bindingPoints.size() == list.size() && (bindingPoints[u] == 0);
	if (!passed)
	{
		return LayoutBindingTestResult(passed,
									   generateLog(String("binding point did not match default"), bindingPoints[u], 0));
	}

	return true;
}